

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void __thiscall StackSolver::solve(StackSolver *this)

{
  int iVar1;
  int4 iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  value_type_conflict1 local_2c;
  int local_28;
  int local_24;
  int4 lastcount;
  int4 count;
  int4 var2;
  int4 var1;
  int4 size;
  int4 i;
  StackSolver *this_local;
  
  _size = this;
  std::vector<int,_std::allocator<int>_>::clear(&this->soln);
  sVar3 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->vnlist);
  local_2c = 0xffff;
  std::vector<int,_std::allocator<int>_>::resize(&this->soln,sVar3,&local_2c);
  duplicate(this);
  propagate(this,0,0);
  sVar3 = std::vector<StackEqn,_std::allocator<StackEqn>_>::size(&this->guess);
  var2 = (int4)sVar3;
  local_28 = var2 + 2;
  do {
    local_24 = 0;
    for (var1 = 0; var1 < var2; var1 = var1 + 1) {
      pvVar4 = std::vector<StackEqn,_std::allocator<StackEqn>_>::operator[](&this->guess,(long)var1)
      ;
      count = pvVar4->var1;
      pvVar4 = std::vector<StackEqn,_std::allocator<StackEqn>_>::operator[](&this->guess,(long)var1)
      ;
      lastcount = pvVar4->var2;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)count);
      if ((*pvVar5 == 0xffff) ||
         (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)lastcount),
         iVar2 = lastcount, *pvVar5 != 0xffff)) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)count);
        if ((*pvVar5 == 0xffff) &&
           (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)lastcount)
           , iVar2 = count, *pvVar5 != 0xffff)) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)lastcount);
          iVar1 = *pvVar5;
          pvVar4 = std::vector<StackEqn,_std::allocator<StackEqn>_>::operator[]
                             (&this->guess,(long)var1);
          propagate(this,iVar2,iVar1 + pvVar4->rhs);
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)count);
          if ((*pvVar5 == 0xffff) &&
             (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->soln,(long)lastcount), *pvVar5 == 0xffff)) {
            local_24 = local_24 + 1;
          }
        }
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->soln,(long)count);
        iVar1 = *pvVar5;
        pvVar4 = std::vector<StackEqn,_std::allocator<StackEqn>_>::operator[]
                           (&this->guess,(long)var1);
        propagate(this,iVar2,iVar1 - pvVar4->rhs);
      }
    }
  } while ((local_24 != local_28) && (local_28 = local_24, 0 < local_24));
  return;
}

Assistant:

void StackSolver::solve(void)

{
  // Use guesses to resolve subsystems not uniquely determined
  int4 i,size,var1,var2,count,lastcount;

  soln.clear();
  soln.resize(vnlist.size(),65535); // Initialize solutions vector
  duplicate();			// Duplicate and sort the equations

  propagate(0,0);		// We know one variable
  size = guess.size();
  lastcount = size+2;
  do {
    count = 0;
    for(i=0;i<size;++i) {
      var1 = guess[i].var1;
      var2 = guess[i].var2;
      if ((soln[var1]!=65535)&&(soln[var2]==65535))
	propagate(var2,soln[var1]-guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]!=65535))
	propagate(var1,soln[var2]+guess[i].rhs);
      else if ((soln[var1]==65535)&&(soln[var2]==65535))
	count += 1;
    }
    if (count == lastcount) break;
    lastcount = count;
  } while(count > 0);
}